

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

void __thiscall Model::load_texture(Model *this,string *filename,string *suffix,TGAImage *img)

{
  bool bVar1;
  long lVar2;
  long *plVar3;
  ostream *poVar4;
  long *plVar5;
  char *pcVar6;
  string texfile;
  long *local_80;
  long local_70;
  long lStack_68;
  string local_60;
  long *local_40 [2];
  long local_30 [2];
  
  lVar2 = std::__cxx11::string::find_last_of((char *)filename,0x108587,0xffffffffffffffff);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)local_40,(ulong)filename);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_40,(ulong)(suffix->_M_dataplus)._M_p);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_70 = *plVar5;
      lStack_68 = plVar3[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar5;
      local_80 = (long *)*plVar3;
    }
    lVar2 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"texture file ",0xd);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_80,lVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," loading ",9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,(char *)local_80,(allocator<char> *)local_40);
    bVar1 = TGAImage::read_tga_file(img,&local_60);
    pcVar6 = "failed";
    if (bVar1) {
      pcVar6 = "ok";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,(ulong)!bVar1 * 4 + 2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    TGAImage::flip_vertically(img);
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
  }
  return;
}

Assistant:

void Model::load_texture(std::string filename, const std::string suffix, TGAImage &img)
{
    size_t dot = filename.find_last_of(".");
    if (dot == std::string::npos) return;
    std::string texfile = filename.substr(0, dot) + suffix;
    std::cerr << "texture file " << texfile << " loading "
              << (img.read_tga_file(texfile.c_str()) ? "ok" : "failed") << std::endl;
    img.flip_vertically();
}